

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O1

void __thiscall Assimp::FBX::BlendShapeChannel::~BlendShapeChannel(BlendShapeChannel *this)

{
  pointer ppSVar1;
  pointer pfVar2;
  
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__BlendShapeChannel_008c1d08;
  ppSVar1 = (this->shapeGeometries).
            super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->shapeGeometries).
                                  super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  pfVar2 = (this->fullWeights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 != (pointer)0x0) {
    operator_delete(pfVar2,(long)(this->fullWeights).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar2);
  }
  Deformer::~Deformer(&this->super_Deformer);
  return;
}

Assistant:

BlendShapeChannel::~BlendShapeChannel()
{

}